

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O2

bool anon_unknown.dwarf_2ec237::TestPresetOutputTruncationHelper
               (optional<cmCTestTypes::TruncationMode> *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  _Optional_payload_base<cmCTestTypes::TruncationMode> _Var2;
  String SStack_48;
  
  if (value == (Value *)0x0) {
    if ((out->super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>)._M_payload.
        super__Optional_payload_base<cmCTestTypes::TruncationMode>._M_engaged != true) {
      return true;
    }
    (out->super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>)._M_payload.
    super__Optional_payload_base<cmCTestTypes::TruncationMode>._M_engaged = false;
    return true;
  }
  bVar1 = Json::Value::isString(value);
  if (bVar1) {
    Json::Value::asString_abi_cxx11_(&SStack_48,value);
    bVar1 = std::operator==(&SStack_48,"tail");
    std::__cxx11::string::~string((string *)&SStack_48);
    if (bVar1) {
      _Var2._M_payload = (_Storage<cmCTestTypes::TruncationMode,_true>)0x0;
      _Var2._M_engaged = true;
      _Var2._5_3_ = 0;
    }
    else {
      Json::Value::asString_abi_cxx11_(&SStack_48,value);
      bVar1 = std::operator==(&SStack_48,"middle");
      std::__cxx11::string::~string((string *)&SStack_48);
      if (bVar1) {
        _Var2._M_payload = (_Storage<cmCTestTypes::TruncationMode,_true>)0x1;
        _Var2._M_engaged = true;
        _Var2._5_3_ = 0;
      }
      else {
        Json::Value::asString_abi_cxx11_(&SStack_48,value);
        bVar1 = std::operator==(&SStack_48,"head");
        std::__cxx11::string::~string((string *)&SStack_48);
        if (!bVar1) goto LAB_001e2a8c;
        _Var2._M_payload = (_Storage<cmCTestTypes::TruncationMode,_true>)0x2;
        _Var2._M_engaged = true;
        _Var2._5_3_ = 0;
      }
    }
    (out->super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>)._M_payload.
    super__Optional_payload_base<cmCTestTypes::TruncationMode> = _Var2;
    bVar1 = true;
  }
  else {
LAB_001e2a8c:
    cmCMakePresetsErrors::INVALID_PRESET(value,state);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TestPresetOutputTruncationHelper(
  cm::optional<cmCTestTypes::TruncationMode>& out, const Json::Value* value,
  cmJSONState* state)
{
  if (!value) {
    out = cm::nullopt;
    return true;
  }

  if (!value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "tail") {
    out = cmCTestTypes::TruncationMode::Tail;
    return true;
  }

  if (value->asString() == "middle") {
    out = cmCTestTypes::TruncationMode::Middle;
    return true;
  }

  if (value->asString() == "head") {
    out = cmCTestTypes::TruncationMode::Head;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}